

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::GenMatcher::
init<Kernel::TypedTermList>(GenMatcher *this,TypedTermList query,uint nextSpecVar)

{
  ulong uVar1;
  uint uVar2;
  
  (this->_boundVars)._cursor = (this->_boundVars)._stack;
  Lib::ArrayMap<Kernel::TermList>::reset(&this->_bindings);
  uVar2 = weight((TermList)0x2ba4b3);
  this->_maxVar = uVar2 - 1;
  uVar1 = (this->_specVars)._size;
  if (uVar1 < nextSpecVar) {
    uVar2 = (int)uVar1 * 2;
    if (uVar2 <= nextSpecVar) {
      uVar2 = nextSpecVar;
    }
    Lib::DArray<Kernel::TermList>::ensure(&this->_specVars,(ulong)uVar2);
  }
  uVar2 = weight((TermList)0x2ba4df);
  Lib::DArray<Lib::ArrayMapEntry<Kernel::TermList>_>::ensure
            (&(this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>,(ulong)uVar2);
  return;
}

Assistant:

void init(TermOrLit query, unsigned nextSpecVar)
      {
        _boundVars.reset();
        // _specVars->reset(); <- does not need to be reset as we only write before we read 
        _bindings.reset();

        _maxVar = weight(query) - 1;
        if(_specVars.size()<nextSpecVar) {
          //_specVars can get really big, but it was introduced instead of hash table
          //during optimizations, as it raised performance by abour 5%.
          _specVars.ensure(std::max(static_cast<unsigned>(_specVars.size()*2), nextSpecVar));
        }
        _bindings.ensure(weight(query));
      }